

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

int BN_ext_count_low_zero_bits(BIGNUM *bn)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> bytes;
  S2LogMessage local_130;
  Storage local_120;
  
  iVar4 = BN_num_bits((BIGNUM *)bn);
  iVar5 = iVar4 + 0xe;
  if (-1 < iVar4 + 7) {
    iVar5 = iVar4 + 7;
  }
  local_120.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
            )(long)(iVar5 >> 3);
  local_120.data_ =
       absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
       Storage::InitializeData(&local_120);
  iVar5 = BN_bn2lebinpad(bn,local_120.data_,
                         (ulong)local_120.size_alloc_.
                                super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                .
                                super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                                .value & 0xffffffff);
  if (local_120.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value != (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 )(long)iVar5) {
    S2LogMessage::S2LogMessage
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x8b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_130.stream_,
               "Check failed: (BN_bn2lebinpad(bn, bytes.data(), bytes.size())) == (bytes.size()) ",
               0x51);
    abort();
  }
  if (local_120.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value == (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                 )0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    pbVar6 = local_120.data_;
    do {
      bVar1 = *pbVar6;
      if (bVar1 == 0) {
        iVar5 = iVar5 + 8;
      }
      else {
        bVar2 = bVar1 & 1;
        bVar3 = bVar1;
        while (bVar2 == 0) {
          iVar5 = iVar5 + 1;
          bVar2 = bVar3 & 2;
          bVar3 = bVar3 >> 1;
        }
      }
    } while ((bVar1 == 0) &&
            (pbVar6 = pbVar6 + 1,
            pbVar6 != local_120.data_ +
                      (long)local_120.size_alloc_.
                            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                            .
                            super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                            .value));
  }
  if (0x100 < (ulong)local_120.size_alloc_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     .
                     super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                     .value) {
    operator_delete(local_120.data_);
  }
  return iVar5;
}

Assistant:

static int BN_ext_count_low_zero_bits(const BIGNUM* bn) {
  // In OpenSSL >= 1.1, BIGNUM is an opaque type, so d and top
  // cannot be accessed.  The bytes must be copied out at a ~25%
  // performance penalty.
  absl::FixedArray<unsigned char> bytes(BN_num_bytes(bn));
  // "le" indicates little endian.
  S2_CHECK_EQ(BN_bn2lebinpad(bn, bytes.data(), bytes.size()), bytes.size());

  int count = 0;
  for (unsigned char c : bytes) {
    if (c == 0) {
      count += 8;
    } else {
      for (; (c & 1) == 0; c >>= 1) {
        ++count;
      }
      break;
    }
  }
  return count;
}